

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O0

void __thiscall
cmCPackGeneratorFactory::RegisterGenerator
          (cmCPackGeneratorFactory *this,string *name,char *generatorDescription,
          CreateGeneratorCall *createGenerator)

{
  cmCPackLog *this_00;
  ostream *this_01;
  char *msg;
  mapped_type *ppCVar1;
  mapped_type *this_02;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream cmCPackLog_msg;
  CreateGeneratorCall *createGenerator_local;
  char *generatorDescription_local;
  string *name_local;
  cmCPackGeneratorFactory *this_local;
  
  if (createGenerator == (CreateGeneratorCall *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    this_01 = std::operator<<((ostream *)local_1a0,"Cannot register generator");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = this->Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGeneratorFactory.cxx"
                    ,0xbd,msg);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  else {
    ppCVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>_>
              ::operator[](&this->GeneratorCreators,name);
    *ppCVar1 = createGenerator;
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->GeneratorDescriptions,name);
    std::__cxx11::string::operator=((string *)this_02,generatorDescription);
  }
  return;
}

Assistant:

void cmCPackGeneratorFactory::RegisterGenerator(
  const std::string& name, const char* generatorDescription,
  CreateGeneratorCall* createGenerator)
{
  if (!createGenerator) {
    cmCPack_Log(this->Logger, cmCPackLog::LOG_ERROR,
                "Cannot register generator" << std::endl);
    return;
  }
  this->GeneratorCreators[name] = createGenerator;
  this->GeneratorDescriptions[name] = generatorDescription;
}